

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigINI::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigINI *this,istream *input)

{
  string *s;
  pointer pCVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  long lVar5;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string line;
  string section;
  string local_90;
  string local_70;
  string local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"default",(allocator<char> *)&item);
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    piVar4 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)input,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      ::std::__cxx11::string::~string((string *)&section);
      ::std::__cxx11::string::~string((string *)&line);
      return __return_storage_ptr__;
    }
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    items.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detail::trim(&line);
    if (line._M_string_length < 2) {
      if (line._M_string_length != 0) {
        cVar2 = *line._M_dataplus._M_p;
        goto LAB_0010b91c;
      }
    }
    else {
      cVar2 = *line._M_dataplus._M_p;
      if (cVar2 == '[') {
        if (line._M_dataplus._M_p[line._M_string_length - 1] == ']') {
          ::std::__cxx11::string::substr((ulong)&item,(ulong)&line);
          ::std::__cxx11::string::operator=((string *)&section,(string *)&item);
          ::std::__cxx11::string::~string((string *)&item);
          goto LAB_0010bb33;
        }
      }
      else {
LAB_0010b91c:
        if (cVar2 == ';') goto LAB_0010bb33;
      }
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                (__return_storage_ptr__);
      pCVar1 = (__return_storage_ptr__->
               super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar5 = ::std::__cxx11::string::find((char)&line,0x3d);
      if (lVar5 == -1) {
        detail::trim_copy(&item,&line);
        ::std::__cxx11::string::operator=((string *)&pCVar1[-1].name,(string *)&item);
        ::std::__cxx11::string::~string((string *)&item);
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&item,"ON",(allocator<char> *)&local_90);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&items,&item
                   ,&items);
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_90,(ulong)&line);
        detail::trim_copy(&item,&local_90);
        ::std::__cxx11::string::operator=((string *)&pCVar1[-1].name,(string *)&item);
        ::std::__cxx11::string::~string((string *)&item);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::substr((ulong)&local_90,(ulong)&line);
        detail::trim_copy(&item,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::string((string *)&local_50,(string *)&item);
        detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_90,&local_50);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&items,&local_90);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      ::std::__cxx11::string::~string((string *)&item);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&section);
      detail::to_lower(&item,&local_70);
      bVar3 = ::std::operator!=(&item,"default");
      ::std::__cxx11::string::~string((string *)&item);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&item,(string *)&section);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (pCVar1 + -1),&item,&items);
        ::std::__cxx11::string::~string((string *)&item);
      }
      s = &pCVar1[-1].name;
      lVar5 = ::std::__cxx11::string::find((char)s,0x2e);
      if (lVar5 != -1) {
        detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&item,s,'.');
        ::std::__cxx11::string::_M_assign((string *)s);
        item._M_string_length = item._M_string_length - 0x20;
        ::std::__cxx11::string::~string((string *)item._M_string_length);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (pCVar1 + -1),
                   pCVar1[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )item._M_dataplus._M_p,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )item._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&item);
      }
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pCVar1[-1].inputs,
                 pCVar1[-1].inputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )items.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )items.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_0010bb33:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&items);
  } while( true );
}

Assistant:

std::vector<ConfigItem> from_config(std::istream &input) const override {
        std::string line;
        std::string section = "default";

        std::vector<ConfigItem> output;

        while(getline(input, line)) {
            std::vector<std::string> items;

            detail::trim(line);
            size_t len = line.length();
            if(len > 1 && line[0] == '[' && line[len - 1] == ']') {
                section = line.substr(1, len - 2);
            } else if(len > 0 && line[0] != ';') {
                output.emplace_back();
                ConfigItem &out = output.back();

                // Find = in string, split and recombine
                auto pos = line.find('=');
                if(pos != std::string::npos) {
                    out.name = detail::trim_copy(line.substr(0, pos));
                    std::string item = detail::trim_copy(line.substr(pos + 1));
                    items = detail::split_up(item);
                } else {
                    out.name = detail::trim_copy(line);
                    items = {"ON"};
                }

                if(detail::to_lower(section) != "default") {
                    out.parents = {section};
                }

                if(out.name.find('.') != std::string::npos) {
                    std::vector<std::string> plist = detail::split(out.name, '.');
                    out.name = plist.back();
                    plist.pop_back();
                    out.parents.insert(out.parents.end(), plist.begin(), plist.end());
                }

                out.inputs.insert(std::end(out.inputs), std::begin(items), std::end(items));
            }
        }
        return output;
    }